

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void __thiscall argsman_tests::util_datadir::test_method(util_datadir *this)

{
  pointer pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  lazy_ostream local_388;
  undefined1 *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  path *local_348;
  path *local_340;
  char *local_338;
  char *local_330;
  assertion_result local_328;
  path local_310;
  path dd_norm;
  ArgsManager args;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&args);
  paVar4 = &dd_norm.super_path._M_pathname.field_2;
  dd_norm.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dd_norm,"-datadir","");
  pcVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path._M_pathname._M_dataplus
           ._M_p;
  paVar5 = &local_310._M_pathname.field_2;
  local_310._M_pathname._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_310,pcVar1,
             pcVar1 + (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path._M_pathname.
                      _M_string_length);
  ArgsManager::ForceSetArg(&args,(string *)&dd_norm,&local_310._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != paVar5) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    local_310._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dd_norm.super_path._M_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(dd_norm.super_path._M_pathname._M_dataplus._M_p,
                    dd_norm.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::GetDataDir(&dd_norm,&args,false);
  local_310._M_pathname._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-datadir","");
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,dd_norm.super_path._M_pathname._M_dataplus._M_p,
             dd_norm.super_path._M_pathname._M_dataplus._M_p +
             dd_norm.super_path._M_pathname._M_string_length);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "/");
  local_58._0_8_ = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar4) {
    local_48._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_48._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_58._0_8_ = &local_48;
  }
  else {
    local_48._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != paVar5) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    local_310._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::ClearPathCache(&args);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_358;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  ArgsManager::GetDataDir((path *)&local_310,&args,false);
  iVar2 = std::filesystem::__cxx11::path::compare(&dd_norm.super_path);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_330 = "";
  local_48._8_8_ = &local_340;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac130;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_348;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_013ac130;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_348 = &local_310;
  local_340 = &dd_norm.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,&local_388,1,2,REQUIRE,0xe561f6,(size_t)&local_338,0x25,(string *)local_58,
             "args.GetDataDirBase()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::filesystem::__cxx11::path::~path(&local_310);
  paVar4 = &local_310._M_pathname.field_2;
  local_310._M_pathname._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-datadir","");
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,dd_norm.super_path._M_pathname._M_dataplus._M_p,
             dd_norm.super_path._M_pathname._M_dataplus._M_p +
             dd_norm.super_path._M_pathname._M_string_length);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "/.");
  local_58._0_8_ = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar5) {
    local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_48._8_8_ = *(long *)((long)&pbVar3->field_2 + 8);
    local_58._0_8_ = &local_48;
  }
  else {
    local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    local_310._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::ClearPathCache(&args);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x29;
  file_00.m_begin = (iterator)&local_398;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3a8,
             msg_00);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  ArgsManager::GetDataDir((path *)&local_310,&args,false);
  iVar2 = std::filesystem::__cxx11::path::compare(&dd_norm.super_path);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_330 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac130;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_340;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_013ac130;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_348;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_348 = &local_310;
  local_340 = &dd_norm.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,&local_388,1,2,REQUIRE,0xe561f6,(size_t)&local_338,0x29,(string *)local_58,
             "args.GetDataDirBase()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::filesystem::__cxx11::path::~path(&local_310);
  paVar4 = &local_310._M_pathname.field_2;
  local_310._M_pathname._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-datadir","");
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,dd_norm.super_path._M_pathname._M_dataplus._M_p,
             dd_norm.super_path._M_pathname._M_dataplus._M_p +
             dd_norm.super_path._M_pathname._M_string_length);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "/./");
  local_58._0_8_ = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar5) {
    local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_48._8_8_ = *(long *)((long)&pbVar3->field_2 + 8);
    local_58._0_8_ = &local_48;
  }
  else {
    local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    local_310._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::ClearPathCache(&args);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2d;
  file_01.m_begin = (iterator)&local_3b8;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c8,
             msg_01);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  ArgsManager::GetDataDir((path *)&local_310,&args,false);
  iVar2 = std::filesystem::__cxx11::path::compare(&dd_norm.super_path);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_330 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac130;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_340;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_013ac130;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_348;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_348 = &local_310;
  local_340 = &dd_norm.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,&local_388,1,2,REQUIRE,0xe561f6,(size_t)&local_338,0x2d,(string *)local_58,
             "args.GetDataDirBase()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::filesystem::__cxx11::path::~path(&local_310);
  paVar4 = &local_310._M_pathname.field_2;
  local_310._M_pathname._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-datadir","");
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,dd_norm.super_path._M_pathname._M_dataplus._M_p,
             dd_norm.super_path._M_pathname._M_dataplus._M_p +
             dd_norm.super_path._M_pathname._M_string_length);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "/.//");
  local_58._0_8_ = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar5) {
    local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_48._8_8_ = *(long *)((long)&pbVar3->field_2 + 8);
    local_58._0_8_ = &local_48;
  }
  else {
    local_48._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  ArgsManager::ForceSetArg(&args,&local_310._M_pathname,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    local_310._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::ClearPathCache(&args);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x31;
  file_02.m_begin = (iterator)&local_3d8;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3e8,
             msg_02);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  ArgsManager::GetDataDir((path *)&local_310,&args,false);
  iVar2 = std::filesystem::__cxx11::path::compare(&dd_norm.super_path);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_330 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac130;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_340;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_013ac130;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_348;
  local_348 = &local_310;
  local_340 = &dd_norm.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,&local_388,1,2,REQUIRE,0xe561f6,(size_t)&local_338,0x31,(string *)local_58,
             "args.GetDataDirBase()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::filesystem::__cxx11::path::~path(&local_310);
  std::filesystem::__cxx11::path::~path(&dd_norm.super_path);
  ArgsManager::~ArgsManager(&args);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_datadir)
{
    // Use local args variable instead of m_args to avoid making assumptions about test setup
    ArgsManager args;
    args.ForceSetArg("-datadir", fs::PathToString(m_path_root));

    const fs::path dd_norm = args.GetDataDirBase();

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/.");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/./");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/.//");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());
}